

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O1

void __thiscall
OpenMD::IndexListContainer::IndexListContainer(IndexListContainer *this,int minIndex,int maxIndex)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  this->maxIndex_ = maxIndex;
  (this->indexContainer_).
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->indexContainer_;
  (this->indexContainer_).
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->indexContainer_;
  (this->indexContainer_).
  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl._M_node.
  _M_size = 0;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)CONCAT44(maxIndex,minIndex);
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->indexContainer_).
            super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

IndexListContainer(int minIndex = 0, int maxIndex = MAX_INTEGER) :
        maxIndex_(maxIndex) {
      indexContainer_.push_back(std::make_pair(minIndex, maxIndex));
    }